

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O0

void __thiscall re2::NFA::NFA(NFA *this,Prog *prog)

{
  int iVar1;
  int len;
  int iVar2;
  int iVar3;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  int nstack;
  undefined4 in_stack_ffffffffffffff78;
  SparseArray<re2::NFA::Thread_*> *in_stack_ffffffffffffff90;
  PODArray<re2::NFA::AddState> *this_00;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  SparseArray<re2::NFA::Thread_*>::SparseArray(in_stack_ffffffffffffff90);
  SparseArray<re2::NFA::Thread_*>::SparseArray(in_stack_ffffffffffffff90);
  PODArray<re2::NFA::AddState>::PODArray((PODArray<re2::NFA::AddState> *)0x231287);
  *in_RDI = in_RSI;
  iVar1 = Prog::start((Prog *)*in_RDI);
  *(int *)(in_RDI + 1) = iVar1;
  *(undefined4 *)((long)in_RDI + 0xc) = 0;
  *(undefined1 *)(in_RDI + 2) = 0;
  *(undefined1 *)((long)in_RDI + 0x11) = 0;
  in_RDI[3] = 0;
  in_RDI[4] = 0;
  this_00 = (PODArray<re2::NFA::AddState> *)(in_RDI + 5);
  Prog::size((Prog *)*in_RDI);
  SparseArray<re2::NFA::Thread_*>::resize
            ((SparseArray<re2::NFA::Thread_*> *)
             CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc
            );
  len = Prog::size((Prog *)*in_RDI);
  SparseArray<re2::NFA::Thread_*>::resize
            ((SparseArray<re2::NFA::Thread_*> *)
             CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc
            );
  iVar1 = Prog::inst_count((Prog *)*in_RDI,kInstCapture);
  iVar1 = iVar1 * 2;
  iVar2 = Prog::inst_count((Prog *)*in_RDI,kInstEmptyWidth);
  iVar2 = iVar1 + iVar2;
  iVar3 = Prog::inst_count((Prog *)*in_RDI,kInstNop);
  PODArray<re2::NFA::AddState>::PODArray(this_00,len);
  PODArray<re2::NFA::AddState>::operator=
            ((PODArray<re2::NFA::AddState> *)CONCAT44(iVar1,iVar3),
             (PODArray<re2::NFA::AddState> *)CONCAT44(iVar2,in_stack_ffffffffffffff78));
  PODArray<re2::NFA::AddState>::~PODArray((PODArray<re2::NFA::AddState> *)0x2313c9);
  in_RDI[0x11] = 0;
  in_RDI[0x12] = 0;
  *(undefined1 *)(in_RDI + 0x13) = 0;
  return;
}

Assistant:

NFA::NFA(Prog* prog) {
  prog_ = prog;
  start_ = prog_->start();
  ncapture_ = 0;
  longest_ = false;
  endmatch_ = false;
  btext_ = NULL;
  etext_ = NULL;
  q0_.resize(prog_->size());
  q1_.resize(prog_->size());
  // See NFA::AddToThreadq() for why this is so.
  int nstack = 2*prog_->inst_count(kInstCapture) +
               prog_->inst_count(kInstEmptyWidth) +
               prog_->inst_count(kInstNop) + 1;  // + 1 for start inst
  stack_ = PODArray<AddState>(nstack);
  free_threads_ = NULL;
  match_ = NULL;
  matched_ = false;
}